

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HVectorBase.cpp
# Opt level: O2

void __thiscall
HVectorBase<double>::copy<HighsCDouble>(HVectorBase<double> *this,HVectorBase<HighsCDouble> *from)

{
  double dVar1;
  double dVar2;
  uint uVar3;
  int iVar4;
  pointer piVar5;
  pointer pHVar6;
  pointer piVar7;
  pointer pdVar8;
  ulong uVar9;
  ulong uVar10;
  
  clear(this);
  this->synthetic_tick = from->synthetic_tick;
  uVar3 = from->count;
  this->count = uVar3;
  piVar5 = (from->index).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  pHVar6 = (from->array).super__Vector_base<HighsCDouble,_std::allocator<HighsCDouble>_>._M_impl.
           super__Vector_impl_data._M_start;
  piVar7 = (this->index).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  pdVar8 = (this->array).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  uVar10 = 0;
  uVar9 = (ulong)uVar3;
  if ((int)uVar3 < 1) {
    uVar9 = uVar10;
  }
  for (; uVar9 != uVar10; uVar10 = uVar10 + 1) {
    iVar4 = piVar5[uVar10];
    dVar1 = pHVar6[iVar4].hi;
    dVar2 = pHVar6[iVar4].lo;
    piVar7[uVar10] = iVar4;
    pdVar8[iVar4] = dVar1 + dVar2;
  }
  return;
}

Assistant:

void HVectorBase<Real>::copy(const HVectorBase<FromReal>* from) {
  /*
   * Copy from another HVector structure to this instance
   * The real type of "from" does not need to be the same, but must be
   * convertible to this HVector's real type.
   */
  clear();
  synthetic_tick = from->synthetic_tick;
  const HighsInt fromCount = count = from->count;
  const HighsInt* fromIndex = &from->index[0];
  const FromReal* fromArray = &from->array[0];
  for (HighsInt i = 0; i < fromCount; i++) {
    const HighsInt iFrom = fromIndex[i];
    const FromReal xFrom = fromArray[iFrom];
    index[i] = iFrom;
    array[iFrom] = Real(xFrom);
  }
}